

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall fasttext::ProductQuantizer::load(ProductQuantizer *this,istream *in)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  vector<float,_std::allocator<float>_> *in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar4;
  vector<float,_std::allocator<float>_> *pvVar5;
  
  std::istream::read((char *)in_RSI,in_RDI + 0x1c);
  std::istream::read((char *)in_RSI,in_RDI + 0x20);
  std::istream::read((char *)in_RSI,in_RDI + 0x24);
  std::istream::read((char *)in_RSI,in_RDI + 0x28);
  std::vector<float,_std::allocator<float>_>::resize
            (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar4 = 0;
  while( true ) {
    uVar1 = (ulong)iVar4;
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x30));
    if (sVar2 <= uVar1) break;
    pvVar5 = in_RSI;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x30),(long)iVar4);
    std::istream::read((char *)in_RSI,(long)pvVar3);
    iVar4 = iVar4 + 1;
    in_RSI = pvVar5;
  }
  return;
}

Assistant:

void ProductQuantizer::load(std::istream& in) {
  in.read((char*)&dim_, sizeof(dim_));
  in.read((char*)&nsubq_, sizeof(nsubq_));
  in.read((char*)&dsub_, sizeof(dsub_));
  in.read((char*)&lastdsub_, sizeof(lastdsub_));
  centroids_.resize(dim_ * ksub_);
  for (auto i = 0; i < centroids_.size(); i++) {
    in.read((char*)&centroids_[i], sizeof(real));
  }
}